

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEAngle.cpp
# Opt level: O2

void __thiscall CEAngle::SetAngle(CEAngle *this,char *angle_str,CEAngleType *angle_type,char *delim)

{
  char cVar1;
  bool bVar2;
  size_type sVar3;
  reference __str;
  reference pcVar4;
  long lVar5;
  invalid_delimiter *this_00;
  initializer_list<char> __l;
  char d;
  new_allocator<char> local_c1;
  iterator __end4;
  vector<double,_std::allocator<double>_> angle_dbl;
  iterator __begin3;
  iterator __end3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  angle_vec;
  
  if (*angle_type < HMS) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&angle_dbl,angle_str,(allocator *)&__end3);
    __begin3._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::__cxx11::stod((string *)&angle_dbl,(size_t *)0x0);
    SetAngle(this,(double *)&__begin3,angle_type);
    std::__cxx11::string::~string((string *)&angle_dbl);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&__end3);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&angle_vec);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&angle_vec,4);
    if (*delim == '\0') {
      angle_dbl.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start._0_2_ = 0x203a;
      std::allocator<char>::allocator();
      __l._M_len = 2;
      __l._M_array = (iterator)&angle_dbl;
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&__begin3,__l,(allocator_type *)&__end3);
      __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&__end3);
      __end3._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::vector<char,_std::allocator<char>_>::begin
                     ((vector<char,_std::allocator<char>_> *)&__begin3);
      __end4 = std::vector<char,_std::allocator<char>_>::end
                         ((vector<char,_std::allocator<char>_> *)&__begin3);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)
                           &__end3,&__end4);
        if (!bVar2) break;
        pcVar4 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)
                           &__end3);
        d = *pcVar4;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&angle_dbl,angle_str,(allocator *)&local_c1);
        lVar5 = std::__cxx11::string::find((char)(string *)&angle_dbl,(ulong)(uint)(int)d);
        std::__cxx11::string::~string((string *)&angle_dbl);
        __gnu_cxx::new_allocator<char>::~new_allocator(&local_c1);
        if (lVar5 != -1) {
          SetAngle(this,angle_str,angle_type,&d);
        }
        __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                  ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)&__end3);
      }
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)&__begin3);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&angle_dbl,angle_str,(allocator *)&__begin3);
      CppEphem::StrOpt::split((string *)&angle_dbl,delim,&angle_vec);
      std::__cxx11::string::~string((string *)&angle_dbl);
      __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&__begin3);
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&angle_vec);
      if (sVar3 < 3) {
        this_00 = (invalid_delimiter *)__cxa_allocate_exception(0xa8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&angle_dbl,
                   "CEAngle::SetAngle(const string&, const CEAngleType&, const char&)",
                   (allocator *)&__end4);
        cVar1 = *delim;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&__end3,1,cVar1,(allocator *)&d);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__begin3,"Could not find specified delimiter: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end3)
        ;
        CEException::invalid_delimiter::invalid_delimiter
                  (this_00,(string *)&angle_dbl,(string *)&__begin3);
        __cxa_throw(this_00,&CEException::invalid_delimiter::typeinfo,
                    CEExceptionHandler::~CEExceptionHandler);
      }
      std::vector<double,_std::allocator<double>_>::vector(&angle_dbl);
      __begin3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&angle_vec);
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&angle_vec);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=(&__begin3,&__end3);
        if (!bVar2) break;
        __str = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__begin3);
        __end4._M_current = (char *)std::__cxx11::stod(__str,(size_t *)0x0);
        std::vector<double,_std::allocator<double>_>::push_back
                  (&angle_dbl,(value_type_conflict *)&__end4);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__begin3);
      }
      SetAngle(this,&angle_dbl,angle_type);
      std::vector<double,_std::allocator<double>_>::~vector(&angle_dbl);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&angle_vec);
  }
  return;
}

Assistant:

void CEAngle::SetAngle(const char*        angle_str,
                       const CEAngleType& angle_type,
                       const char&        delim)
{
    // Angle is a degree or radian
    if ((angle_type == CEAngleType::DEGREES) || (angle_type == CEAngleType::RADIANS)) {
        SetAngle(std::stod(angle_str), angle_type);
    }

    // Otherwise the angle is a delimited string (i.e. something like HH:MM:SS)
    else {

        // Create a string vector to hold the parsed values
        std::vector<std::string> angle_vec;
        angle_vec.reserve(4);

        // Handle specific delimitors
        if (delim != 0) {

            // Split the string
            CppEphem::StrOpt::split(angle_str, delim, &angle_vec);

            // Throw an error if the string was not properly split
            if (angle_vec.size() < 3) {
                throw CEException::invalid_delimiter(
                    "CEAngle::SetAngle(const string&, const CEAngleType&, const char&)",
                    "Could not find specified delimiter: " + std::string(1,delim));
            }

            // Now format the string in the appropriate way
            std::vector<double> angle_dbl;
            for (auto& ang : angle_vec) {
                angle_dbl.push_back(std::stod(ang));
            }
            SetAngle(angle_dbl, angle_type);
        } 

        // Handle delimiter agnostic format
        else if (delim == 0) {

            // Create vector of delimiters to be tried
            std::vector<char> delim_list = {':', ' '};

            // Loop through the list of delimiters
            for (char d : delim_list) {
                // Check if the delimiter is in the string
                if (std::string(angle_str).find(d) != std::string::npos) {
                    // Try to set the angle
                    SetAngle(angle_str, angle_type, d);
                }
            }
        }
    }

    return;
}